

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::Build(Builder *this,string *err)

{
  BuildConfig *pBVar1;
  CommandRunner *pCVar2;
  BuildStatus *pBVar3;
  const_iterator __position;
  Edge *edge;
  bool bVar4;
  int iVar5;
  CommandRunner *pCVar6;
  uint64_t uVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  Result result;
  int local_6c;
  Result local_68;
  Plan *local_38;
  
  if (((this->plan_).wanted_edges_ < 1) || (iVar11 = (this->plan_).command_edges_, iVar11 < 1)) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build.cc"
                  ,0x32b,"bool Builder::Build(string *)");
  }
  this->status_->total_edges_ = iVar11;
  pBVar1 = this->config_;
  local_6c = pBVar1->failures_allowed;
  if ((this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl == (CommandRunner *)0x0) {
    if (pBVar1->dry_run == true) {
      pCVar6 = (CommandRunner *)operator_new(0x58);
      pCVar6->_vptr_CommandRunner = (_func_int **)&PTR__DryRunCommandRunner_001d4be0;
      pCVar6[1]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[2]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[3]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[4]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[5]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[6]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[7]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[8]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[9]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[10]._vptr_CommandRunner = (_func_int **)0x0;
      std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::_M_initialize_map
                ((_Deque_base<Edge_*,_std::allocator<Edge_*>_> *)(pCVar6 + 1),0);
    }
    else {
      pCVar6 = (CommandRunner *)operator_new(0x2f0);
      pCVar6->_vptr_CommandRunner = (_func_int **)&PTR__RealCommandRunner_001d4b80;
      pCVar6[1]._vptr_CommandRunner = (_func_int **)pBVar1;
      SubprocessSet::SubprocessSet((SubprocessSet *)(pCVar6 + 2));
      *(undefined4 *)&pCVar6[0x59]._vptr_CommandRunner = 0;
      pCVar6[0x5a]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[0x5b]._vptr_CommandRunner = (_func_int **)(pCVar6 + 0x59);
      pCVar6[0x5c]._vptr_CommandRunner = (_func_int **)(pCVar6 + 0x59);
      pCVar6[0x5d]._vptr_CommandRunner = (_func_int **)0x0;
    }
    pCVar2 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    (this->command_runner_)._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = pCVar6;
    if (pCVar2 != (CommandRunner *)0x0) {
      (*pCVar2->_vptr_CommandRunner[1])();
    }
  }
  local_38 = &this->plan_;
  pBVar3 = this->status_;
  uVar7 = Stopwatch::Now(&(pBVar3->overall_rate_).stopwatch_);
  (pBVar3->overall_rate_).stopwatch_.started_ = uVar7;
  uVar7 = Stopwatch::Now(&(pBVar3->current_rate_).stopwatch_);
  (pBVar3->current_rate_).stopwatch_.started_ = uVar7;
  iVar11 = 0;
  while (0 < (this->plan_).wanted_edges_) {
    iVar5 = (this->plan_).command_edges_;
    iVar10 = iVar11;
    while( true ) {
      if (iVar5 < 1) goto LAB_0017c277;
      if (local_6c == 0) {
        if (iVar11 != 0) goto LAB_0017c177;
        BuildStatus::BuildFinished(this->status_);
        pcVar9 = (char *)err->_M_string_length;
        if (this->config_->failures_allowed < 2) {
          pcVar8 = "subcommand failed";
        }
        else {
          pcVar8 = "subcommands failed";
        }
        goto LAB_0017c315;
      }
      iVar5 = (*((this->command_runner_)._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[2]
              )();
      if (((char)iVar5 == '\0') ||
         ((this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) break;
      __position._M_node = (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      edge = *(Edge **)(__position._M_node + 1);
      std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
      erase_abi_cxx11_((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
                        *)&(this->plan_).ready_,__position);
      if (edge == (Edge *)0x0) break;
      bVar4 = StartEdge(this,edge,err);
      if (!bVar4) {
LAB_0017c25e:
        Cleanup(this);
        BuildStatus::BuildFinished(this->status_);
        return false;
      }
      bVar4 = Edge::is_phony(edge);
      if (bVar4) {
        bVar4 = Plan::EdgeFinished(local_38,edge,kEdgeSucceeded,err);
        if (!bVar4) goto LAB_0017c25e;
      }
      else {
        iVar10 = iVar10 + 1;
      }
      if ((this->plan_).wanted_edges_ < 1) goto LAB_0017c277;
      iVar5 = (this->plan_).command_edges_;
    }
    iVar11 = iVar10;
    if (iVar10 == 0) {
      BuildStatus::BuildFinished(this->status_);
      pcVar9 = (char *)err->_M_string_length;
      if (local_6c < this->config_->failures_allowed) {
        pcVar8 = "cannot make progress due to previous errors";
      }
      else {
        pcVar8 = "stuck [this is a bug]";
      }
LAB_0017c315:
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar9,(ulong)pcVar8);
      return false;
    }
LAB_0017c177:
    local_68.edge = (Edge *)0x0;
    local_68.output._M_dataplus._M_p = (pointer)&local_68.output.field_2;
    local_68.output._M_string_length = 0;
    local_68.output.field_2._M_local_buf[0] = '\0';
    iVar5 = (*((this->command_runner_)._M_t.
               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[4])
                      ();
    if (((byte)iVar5 & local_68.status != ExitInterrupted) == 0) {
      Cleanup(this);
      BuildStatus::BuildFinished(this->status_);
      bVar4 = false;
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x194fd1);
    }
    else {
      bVar4 = FinishCommand(this,&local_68,err);
      iVar11 = iVar11 + -1;
      if (!bVar4) {
        Cleanup(this);
        BuildStatus::BuildFinished(this->status_);
      }
      else {
        local_6c = local_6c - (uint)(local_68.status != ExitSuccess && local_6c != 0);
      }
      bVar4 = bVar4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.output._M_dataplus._M_p != &local_68.output.field_2) {
      operator_delete(local_68.output._M_dataplus._M_p,
                      CONCAT71(local_68.output.field_2._M_allocated_capacity._1_7_,
                               local_68.output.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar4) {
      return false;
    }
  }
LAB_0017c277:
  BuildStatus::BuildFinished(this->status_);
  return true;
}

Assistant:

bool DryRunCommandRunner::CanRunMore() const {
  return true;
}